

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O1

cupdlp_retcode
cupdlp_l2norm_scaling
          (CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
          cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  uint len;
  int len_00;
  int iVar1;
  int iVar2;
  cupdlp_int *pcVar3;
  cupdlp_float *pcVar4;
  cupdlp_float *col_scaling;
  cupdlp_float *row_scaling;
  long lVar5;
  ulong uVar6;
  size_t __nmemb;
  cupdlp_retcode cVar7;
  size_t sVar8;
  ulong uVar9;
  double dVar10;
  cupdlp_float cVar11;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  __nmemb = (size_t)len_00;
  col_scaling = (cupdlp_float *)calloc(__nmemb,8);
  cVar7 = 1;
  if ((col_scaling == (cupdlp_float *)0x0) ||
     (row_scaling = (cupdlp_float *)calloc((long)(int)len,8), row_scaling == (cupdlp_float *)0x0)) {
    row_scaling = (cupdlp_float *)0x0;
  }
  else {
    if (0 < (int)len) {
      if (0 < len_00) {
        sVar8 = 0;
        do {
          iVar1 = csc->colMatBeg[sVar8];
          iVar2 = csc->colMatBeg[sVar8 + 1];
          cVar11 = 1.0;
          if (iVar2 != iVar1) {
            dVar10 = GenNorm(csc->colMatElem + iVar1,iVar2 - iVar1,2.0);
            if (dVar10 < 0.0) {
              cVar11 = sqrt(dVar10);
            }
            else {
              cVar11 = SQRT(dVar10);
            }
          }
          col_scaling[sVar8] = cVar11;
          sVar8 = sVar8 + 1;
        } while (__nmemb != sVar8);
      }
      iVar1 = csc->colMatBeg[__nmemb];
      if (0 < (long)iVar1) {
        pcVar3 = csc->colMatIdx;
        pcVar4 = csc->colMatElem;
        lVar5 = 0;
        do {
          row_scaling[pcVar3[lVar5]] = pcVar4[lVar5] * pcVar4[lVar5] + row_scaling[pcVar3[lVar5]];
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      uVar9 = 1;
      if (1 < (int)len) {
        uVar9 = (ulong)len;
      }
      uVar6 = 0;
      do {
        dVar10 = row_scaling[uVar6];
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        row_scaling[uVar6] =
             (cupdlp_float)
             (~-(ulong)(dVar10 == 0.0) & (ulong)dVar10 |
             -(ulong)(dVar10 == 0.0) & 0x3ff0000000000000);
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    scale_problem(csc,cost,lower,upper,rhs,col_scaling,row_scaling);
    cupdlp_cdot(scaling->colScale,col_scaling,len_00);
    cupdlp_cdot(scaling->rowScale,row_scaling,len);
    cVar7 = 0;
  }
  free(col_scaling);
  free(row_scaling);
  return cVar7;
}

Assistant:

cupdlp_retcode cupdlp_l2norm_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                     cupdlp_float *lower,
                                     cupdlp_float *upper,
                                     cupdlp_float *rhs,
                                     CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_l2norm_scaling(CUPDLPwork *work)
{
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  if (nRows > 0) {
    for (int j = 0; j < nCols; j++) {
      if (csc->colMatBeg[j] == csc->colMatBeg[j + 1]) {
        current_col_scaling[j] = 1.0;
      } else {
        current_col_scaling[j] =
            SQRTF(GenNorm(&csc->colMatElem[csc->colMatBeg[j]],
                          csc->colMatBeg[j + 1] - csc->colMatBeg[j], 2.0));
      }
    }

    for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
      current_row_scaling[csc->colMatIdx[i]] += pow(csc->colMatElem[i], 2.0);
    }
    for (int i = 0; i < nRows; i++) {
      current_row_scaling[i] = SQRTF(SQRTF(current_row_scaling[i]));
      if (current_row_scaling[i] == 0.0) {
        current_row_scaling[i] = 1.0;
      }
    }
  }
  // apply scaling
  // scale_problem(work, current_col_scaling, current_row_scaling);
  scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                current_row_scaling);

  // update scaling
  cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
  cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);

exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}